

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

void __thiscall
QMainWindowLayout::hover(QMainWindowLayout *this,QLayoutItem *hoverTarget,QPoint *mousePos)

{
  QMainWindowLayoutState *pQVar1;
  int *piVar2;
  qsizetype qVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  QDockAreaLayoutItem *pQVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  Representation RVar14;
  Data *pDVar15;
  QDebug QVar16;
  Data *pDVar17;
  undefined1 **ppuVar18;
  bool bVar19;
  char cVar20;
  int iVar21;
  DockWidgetArea DVar22;
  DockWidgetAreas DVar23;
  Shape SVar24;
  uint uVar25;
  ToolBarAreas TVar26;
  QWidget *pQVar27;
  undefined4 extraout_var;
  long lVar28;
  QWidget *pQVar29;
  QWidgetPrivate *pQVar30;
  QScreen *pQVar31;
  QScreen *pQVar32;
  QDockWidget *pQVar33;
  QToolBar *this_00;
  QLoggingCategory *pQVar34;
  QDockWidgetGroupWindow *pQVar35;
  QLayout *pQVar36;
  undefined1 *puVar37;
  QSize QVar38;
  QTabBar *pQVar39;
  QPoint QVar40;
  QArrayDataPointer<QDockAreaLayoutItem> *pQVar41;
  const_iterator __begin2;
  QMainWindowLayout *pQVar42;
  QPoint *pos_00;
  int iVar43;
  QLayoutItem *pQVar44;
  QList<QDockWidget_*> *this_01;
  long lVar45;
  QMainWindowLayout *pQVar46;
  QArrayDataPointer<QToolBarAreaLayoutLine> *this_02;
  DockPosition _dockPos;
  long in_FS_OFFSET;
  QByteArrayView QVar47;
  QByteArrayView QVar48;
  QByteArrayView QVar49;
  QByteArrayView QVar50;
  QByteArrayView QVar51;
  QByteArrayView QVar52;
  QByteArrayView QVar53;
  QByteArrayView QVar54;
  QByteArrayView QVar55;
  QByteArrayView QVar56;
  QByteArrayView QVar57;
  QByteArrayView QVar58;
  QByteArrayView QVar59;
  QByteArrayView QVar60;
  QByteArrayView QVar61;
  QRect QVar62;
  QPoint pos;
  QWidget *w;
  undefined8 auStack_7b0 [4];
  undefined1 auStack_78f [8];
  undefined1 auStack_787 [15];
  undefined8 auStack_778 [9];
  undefined4 auStack_730 [132];
  code *pcStack_520;
  QWidget *local_510;
  QMainWindowLayout *local_508;
  QLayoutItem *local_500;
  QMainWindowLayoutState *local_4f8;
  QPoint *local_4f0;
  QArrayData *local_4e8;
  QWidget *local_4e0;
  QArrayDataPointer<int> local_4d8;
  QPoint local_4c0;
  QArrayData *local_4b8;
  undefined1 local_4b0 [8];
  QArrayData *local_4a8;
  undefined1 local_4a0 [8];
  undefined1 local_498 [8];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  QDebug local_470;
  QDebug local_468;
  undefined1 local_460 [16];
  QDebug local_450;
  QtPrivate local_448 [8];
  undefined1 local_440 [8];
  QDebug local_438;
  undefined1 local_430 [16];
  QDebug local_420;
  QList<QDockWidget_*> local_418;
  undefined1 local_3f8 [16];
  QDebug local_3e8;
  QDebug local_3e0;
  undefined1 local_3d8 [40];
  QMainWindow *local_3b0;
  undefined1 local_3a8 [224];
  QMainWindowLayout local_2c8;
  DockWidgetArea local_2c0 [2];
  DockWidgetArea aDStack_2b8 [2];
  QRect local_2b0;
  QLayoutItem *local_2a0;
  QMainWindow *pQStack_298;
  QRect local_290 [26];
  QArrayDataPointer<QDockAreaLayoutItem> local_f0 [2];
  int local_c0;
  QMainWindowLayout local_bc;
  QArrayData *local_b8;
  QWidget **local_b0;
  qsizetype local_a8;
  undefined1 local_a0 [8];
  QWidget *local_98;
  undefined1 **local_90;
  undefined1 *local_88;
  QLayoutItem *pQStack_80;
  QMainWindow *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  int *piStack_60;
  Data *local_58;
  QWidget **ppQStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcStack_520 = (code *)0x4372e4;
  pQVar44 = hoverTarget;
  pQVar27 = QLayout::parentWidget((QLayout *)this);
  iVar43 = (int)pQVar44;
  if ((pQVar27->data->widget_attributes & 0x8000) == 0) goto LAB_00437302;
  pcStack_520 = (code *)0x4372f6;
  pQVar27 = QLayout::parentWidget((QLayout *)this);
  pcStack_520 = (code *)0x4372fe;
  bVar19 = QWidget::isMinimized(pQVar27);
  if (((bVar19) || (hoverTarget == (QLayoutItem *)0x0)) || (*(long *)(this + 0x7d8) != 0))
  goto LAB_00437302;
  pcStack_520 = (code *)0x437343;
  iVar21 = (*hoverTarget->_vptr_QLayoutItem[0xd])(hoverTarget);
  pQVar27 = (QWidget *)CONCAT44(extraout_var,iVar21);
  pcStack_520 = (code *)0x43734e;
  QWidget::raise(pQVar27,iVar43);
  local_510 = pQVar27;
  local_500 = hoverTarget;
  if (((byte)this[0x700] & 0x20) != 0) {
    pcStack_520 = (code *)0x437374;
    lVar28 = QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
    if (lVar28 == 0) {
      pcStack_520 = (code *)0x437388;
      lVar28 = QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
      if (lVar28 == 0) goto LAB_004376a9;
    }
    local_90 = &local_88;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    ppQStack_50 = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    piStack_60 = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = (QMainWindow *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_80 = (QLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
    local_a0 = (undefined1  [8])&DAT_0000000a;
    local_98 = (QWidget *)0x0;
    pcStack_520 = (code *)0x4373d4;
    local_4f0 = mousePos;
    pQVar29 = QLayout::parentWidget((QLayout *)this);
    lVar28 = *(long *)&pQVar29->field_0x8;
    local_4e8 = *(QArrayData **)(lVar28 + 0x18);
    pQVar42 = *(QMainWindowLayout **)(lVar28 + 0x20);
    lVar28 = *(long *)(lVar28 + 0x28);
    if (local_4e8 != (QArrayData *)0x0) {
      LOCK();
      (local_4e8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_4e8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (lVar28 != 0) {
      pQVar46 = pQVar42 + lVar28 * 8;
      local_508 = pQVar46;
      do {
        pQVar29 = *(QWidget **)pQVar42;
        if ((pQVar29 != (QWidget *)0x0) &&
           ((*(byte *)(*(long *)&pQVar29->field_0x8 + 0x30) & 1) != 0)) {
          pcStack_520 = (code *)0x437440;
          local_418.d.d = (Data *)pQVar29;
          lVar28 = QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
          if (lVar28 == 0) {
            pcStack_520 = (code *)0x437455;
            lVar28 = QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
            if (lVar28 == 0) goto LAB_004375d6;
          }
          if ((((QWidget *)local_418.d.d != pQVar27) &&
              ((((*(QWidgetData **)((long)local_418.d.d + 0x20))->window_flags).
                super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i &
               1) != 0)) &&
             (((*(QWidgetData **)((long)local_418.d.d + 0x20))->widget_attributes & 0x8000) != 0)) {
            pcStack_520 = (code *)0x437484;
            bVar19 = QWidget::isMinimized((QWidget *)local_418.d.d);
            if (!bVar19) {
              if ((undefined1  [8])local_98 == local_a0) {
                local_3d8._0_4_ = SUB84(local_418.d.d,0);
                local_3d8._4_4_ = (undefined4)((ulong)local_418.d.d >> 0x20);
                pcStack_520 = (code *)0x4374cc;
                QVLABase<QWidget*>::emplace_back_impl<QWidget*>
                          ((QVLABase<QWidget*> *)local_a0,10,&local_88,(QWidget **)local_3d8);
              }
              else {
                pcStack_520 = (code *)0x4374f0;
                QVLABase<QWidget*>::emplace_back_impl<QWidget*const&>
                          ((QVLABase<QWidget*> *)local_a0,10,&local_88,(QWidget **)&local_418);
              }
            }
          }
          pcStack_520 = (code *)0x437500;
          lVar28 = QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
          if (lVar28 != 0) {
            local_4f8 = *(QMainWindowLayoutState **)(*(long *)(lVar28 + 8) + 0x18);
            lVar28 = *(long *)(*(long *)(lVar28 + 8) + 0x28);
            if (local_4f8 != (QMainWindowLayoutState *)0x0) {
              LOCK();
              ((__atomic_base<int> *)&(local_4f8->rect).x1.m_i)->_M_i =
                   ((__atomic_base<int> *)&(local_4f8->rect).x1.m_i)->_M_i + 1;
              UNLOCK();
            }
            if (lVar28 != 0) {
              lVar45 = 0;
              do {
                pcStack_520 = (code *)0x437542;
                pQVar27 = (QWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
                if (((pQVar27 != local_510 && pQVar27 != (QWidget *)0x0) &&
                    ((((*(QWidgetData **)(&pQVar27->field_0x14 + 0xc))->window_flags).
                      super_QFlagsStorageHelper<Qt::WindowType,_4>.
                      super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) &&
                   (((*(QWidgetData **)(&pQVar27->field_0x14 + 0xc))->widget_attributes & 0x8000) !=
                    0)) {
                  pcStack_520 = (code *)0x437570;
                  bVar19 = QWidget::isMinimized(pQVar27);
                  if (!bVar19) {
                    local_3d8._0_4_ = SUB84(pQVar27,0);
                    local_3d8._4_4_ = (undefined4)((ulong)pQVar27 >> 0x20);
                    pcStack_520 = (code *)0x43759e;
                    QVLABase<QWidget*>::emplace_back_impl<QWidget*>
                              ((QVLABase<QWidget*> *)local_a0,10,&local_88,(QWidget **)local_3d8);
                  }
                }
                lVar45 = lVar45 + 8;
              } while (lVar28 << 3 != lVar45);
            }
            pQVar46 = local_508;
            pQVar27 = local_510;
            if (local_4f8 != (QMainWindowLayoutState *)0x0) {
              LOCK();
              ((__atomic_base<int> *)&(local_4f8->rect).x1.m_i)->_M_i =
                   ((__atomic_base<int> *)&(local_4f8->rect).x1.m_i)->_M_i + -1;
              UNLOCK();
              if (((__atomic_base<int> *)&(local_4f8->rect).x1.m_i)->_M_i == 0) {
                pcStack_520 = (code *)0x4375d6;
                QArrayData::deallocate((QArrayData *)local_4f8,8,0x10);
              }
            }
          }
        }
LAB_004375d6:
        pQVar42 = pQVar42 + 8;
      } while (pQVar42 != pQVar46);
    }
    ppuVar18 = local_90;
    if (local_98 != (QWidget *)0x0) {
      lVar45 = (long)local_98 << 3;
      lVar28 = 0;
      do {
        pQVar27 = *(QWidget **)((long)ppuVar18 + lVar28);
        pcStack_520 = (code *)0x43760c;
        pQVar30 = qt_widget_private(local_510);
        pcStack_520 = (code *)0x437614;
        pQVar31 = QWidgetPrivate::associatedScreen(pQVar30);
        pcStack_520 = (code *)0x43761f;
        pQVar30 = qt_widget_private(pQVar27);
        pcStack_520 = (code *)0x437627;
        pQVar32 = QWidgetPrivate::associatedScreen(pQVar30);
        if (((pQVar31 == pQVar32) || (pQVar31 == (QScreen *)0x0)) || (pQVar32 == (QScreen *)0x0)) {
          pcStack_520 = (code *)0x43764a;
          cVar20 = QRect::contains((QPoint *)&pQVar27->data->crect,SUB81(local_4f0,0));
          if (cVar20 != '\0') {
            pcStack_520 = (code *)0x437d62;
            pQVar27 = (QWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
            pos_00 = local_4f0;
            pQVar44 = local_500;
            if (pQVar27 != (QWidget *)0x0) {
              pcStack_520 = (code *)0x437d80;
              pQVar29 = QDockWidget::widget((QDockWidget *)pQVar27);
              iVar43 = (int)pQVar29;
              pcStack_520 = (code *)0x437d92;
              lVar28 = QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
              if (lVar28 == 0) {
                pcStack_520 = (code *)0x437da3;
                pQVar35 = createTabbedDockWindow(this);
                pcStack_520 = (code *)0x437db6;
                QWidget::setGeometry(&pQVar35->super_QWidget,&pQVar27->data->crect);
                pcStack_520 = (code *)0x437dbe;
                pQVar36 = QWidget::layout(&pQVar35->super_QWidget);
                local_4f8 = (QMainWindowLayoutState *)&pQVar36[4].super_QLayoutItem;
                pcStack_520 = (code *)0x437dd4;
                SVar24 = tabwidgetPositionToTabBarShape(pQVar27);
                local_508 = (QMainWindowLayout *)CONCAT44(local_508._4_4_,SVar24);
                pcStack_520 = (code *)0x437de3;
                DVar22 = dockWidgetArea(this,pQVar27);
                uVar25 = DVar22 - LeftDockWidgetArea;
                local_4e0 = pQVar27;
                if ((uVar25 < 8) && ((0x8bU >> (uVar25 & 0x1f) & 1) != 0)) {
                  _dockPos = *(DockPosition *)(&DAT_006d9c90 + (ulong)uVar25 * 4);
                }
                else {
                  pcStack_520 = (code *)0x4388f2;
                  DVar22 = dockWidgetArea(this,local_510);
                  if (DVar22 == LeftDockWidgetArea) {
                    _dockPos = LeftDock;
                  }
                  else if (DVar22 == BottomDockWidgetArea) {
                    _dockPos = BottomDock;
                  }
                  else {
                    _dockPos = RightDock;
                    if (DVar22 == TopDockWidgetArea) {
                      _dockPos = TopDock;
                    }
                  }
                }
                pcStack_520 = (code *)0x43892c;
                pQVar27 = QLayout::parentWidget((QLayout *)this);
                pcStack_520 = (code *)0x43894f;
                QDockAreaLayoutInfo::QDockAreaLayoutInfo
                          ((QDockAreaLayoutInfo *)local_3d8,(int *)(this + 0x3a0),_dockPos,
                           Horizontal,(int)local_508,(QMainWindow *)pQVar27);
                pQVar1 = local_4f8;
                pcStack_520 = (code *)0x43895f;
                QDockAreaLayoutInfo::operator=
                          ((QDockAreaLayoutInfo *)local_4f8,(QDockAreaLayoutInfo *)local_3d8);
                pcStack_520 = (code *)0x438967;
                QDockAreaLayoutInfo::~QDockAreaLayoutInfo((QDockAreaLayoutInfo *)local_3d8);
                pcStack_520 = (code *)0x43896f;
                pQVar39 = getTabBar(this);
                pQVar27 = local_4e0;
                pQVar36[7].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)pQVar39;
                pQVar36[7].field_0x8 = 1;
                pcStack_520 = (code *)0x43898d;
                QDockAreaLayoutInfo::add((QDockAreaLayoutInfo *)pQVar1,local_4e0);
                pcStack_520 = (code *)0x4389a7;
                QDockAreaLayoutInfo::add
                          ((QDockAreaLayoutInfo *)(this + (ulong)_dockPos * 0x70 + 0x1e0),
                           &pQVar35->super_QWidget);
                pcStack_520 = (code *)0x4389b2;
                QWidget::setParent(pQVar27,&pQVar35->super_QWidget);
                iVar43 = (int)pQVar35;
                pcStack_520 = (code *)0x4389b7;
                pQVar34 = QtPrivateLogging::lcQpaDockWidgets();
                pos_00 = local_4f0;
                pQVar44 = local_500;
                if (((pQVar34->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
                  local_3d8._24_8_ = pQVar34->name;
                  local_3d8._0_4_ = 2;
                  local_3d8._4_4_ = 0;
                  local_3d8._8_4_ = 0;
                  local_3d8._12_4_ = 0;
                  local_3d8._16_4_ = 0;
                  local_3d8._20_4_ = 0;
                  pcStack_520 = (code *)0x4389fa;
                  QMessageLogger::debug();
                  QVar16.stream = local_3e0.stream;
                  pcStack_520 = (code *)0x438a19;
                  QVar58.m_data = (storage_type *)0x8;
                  QVar58.m_size = (qsizetype)&local_418;
                  QString::fromUtf8(QVar58);
                  pcStack_520 = (code *)0x438a24;
                  QTextStream::operator<<((QTextStream *)QVar16.stream,(QString *)&local_418);
                  pos_00 = local_4f0;
                  if ((QWidget *)local_418.d.d != (QWidget *)0x0) {
                    LOCK();
                    *(int *)local_418.d.d = *(int *)local_418.d.d + -1;
                    UNLOCK();
                    if (*(int *)local_418.d.d == 0) {
                      pcStack_520 = (code *)0x438a4e;
                      QArrayData::deallocate(&(local_418.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (*(QTextStream *)(local_3e0.stream + 0x30) == (QTextStream)0x1) {
                    pcStack_520 = (code *)0x438a66;
                    QTextStream::operator<<((QTextStream *)local_3e0.stream,' ');
                  }
                  *(int *)((QTextStream *)local_3e0.stream + 0x28) =
                       *(int *)((QTextStream *)local_3e0.stream + 0x28) + 1;
                  pcStack_520 = (code *)0x438a8e;
                  ::operator<<((Stream *)&local_4d8,(QWidget *)local_498);
                  pDVar15 = local_4d8.d;
                  pcStack_520 = (code *)0x438aad;
                  QVar59.m_data = (storage_type *)0x12;
                  QVar59.m_size = (qsizetype)&local_418;
                  QString::fromUtf8(QVar59);
                  pcStack_520 = (code *)0x438ab8;
                  QTextStream::operator<<((QTextStream *)pDVar15,(QString *)&local_418);
                  if ((QWidget *)local_418.d.d != (QWidget *)0x0) {
                    LOCK();
                    *(int *)local_418.d.d = *(int *)local_418.d.d + -1;
                    UNLOCK();
                    if (*(int *)local_418.d.d == 0) {
                      pcStack_520 = (code *)0x438add;
                      QArrayData::deallocate(&(local_418.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((char)local_4d8.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>.
                            _M_i == '\x01') {
                    pcStack_520 = (code *)0x438af2;
                    QTextStream::operator<<((QTextStream *)local_4d8.d,' ');
                  }
                  local_490._0_8_ = local_4d8.d;
                  *(int *)&local_4d8.d[2].super_QArrayData.alloc =
                       (int)local_4d8.d[2].super_QArrayData.alloc + 1;
                  pcStack_520 = (code *)0x438b1b;
                  pQVar29 = (QWidget *)local_490;
                  ::operator<<((Stream *)(local_490 + 8),(QWidget *)local_490);
                  iVar43 = (int)pQVar29;
                  pcStack_520 = (code *)0x438b23;
                  QDebug::~QDebug((QDebug *)(local_490 + 8));
                  pcStack_520 = (code *)0x438b2b;
                  QDebug::~QDebug((QDebug *)local_490);
                  pcStack_520 = (code *)0x438b35;
                  QDebug::~QDebug((QDebug *)&local_4d8);
                  pcStack_520 = (code *)0x438b42;
                  QDebug::~QDebug((QDebug *)local_498);
                  pcStack_520 = (code *)0x438b4f;
                  QDebug::~QDebug(&local_3e0);
                  pQVar44 = local_500;
                }
              }
              pcStack_520 = (code *)0x438b6b;
              QWidget::show(pQVar27);
              pcStack_520 = (code *)0x438b70;
              pQVar34 = QtPrivateLogging::lcQpaDockWidgets();
              if (((pQVar34->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
                local_3d8._24_8_ = pQVar34->name;
                local_3d8._0_4_ = 2;
                local_3d8._4_4_ = 0;
                local_3d8._8_4_ = 0;
                local_3d8._12_4_ = 0;
                local_3d8._16_4_ = 0;
                local_3d8._20_4_ = 0;
                pcStack_520 = (code *)0x438bb3;
                QMessageLogger::debug();
                pDVar15 = local_4d8.d;
                pcStack_520 = (code *)0x438bd2;
                QVar60.m_data = (storage_type *)0x7;
                QVar60.m_size = (qsizetype)&local_418;
                QString::fromUtf8(QVar60);
                pcStack_520 = (code *)0x438bdd;
                QTextStream::operator<<((QTextStream *)pDVar15,(QString *)&local_418);
                if ((QWidget *)local_418.d.d != (QWidget *)0x0) {
                  LOCK();
                  *(int *)local_418.d.d = *(int *)local_418.d.d + -1;
                  UNLOCK();
                  if (*(int *)local_418.d.d == 0) {
                    pcStack_520 = (code *)0x438c02;
                    QArrayData::deallocate(&(local_418.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((char)local_4d8.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>.
                          _M_i == '\x01') {
                  pcStack_520 = (code *)0x438c17;
                  QTextStream::operator<<((QTextStream *)local_4d8.d,' ');
                }
                local_4a8 = &(local_4d8.d)->super_QArrayData;
                *(int *)&local_4d8.d[2].super_QArrayData.alloc =
                     (int)local_4d8.d[2].super_QArrayData.alloc + 1;
                pcStack_520 = (code *)0x438c3a;
                pQVar33 = (QDockWidget *)&local_4a8;
                ::operator<<((Stream *)local_4a0,(QDockWidget *)&local_4a8);
                iVar43 = (int)pQVar33;
                pcStack_520 = (code *)0x438c42;
                QDebug::~QDebug((QDebug *)local_4a0);
                pcStack_520 = (code *)0x438c4a;
                QDebug::~QDebug((QDebug *)&local_4a8);
                pcStack_520 = (code *)0x438c54;
                QDebug::~QDebug((QDebug *)&local_4d8);
                pos_00 = local_4f0;
              }
              pcStack_520 = (code *)0x438c66;
              QWidget::raise(local_510,iVar43);
              pcStack_520 = (code *)0x438c6b;
              pQVar34 = QtPrivateLogging::lcQpaDockWidgets();
              if (((pQVar34->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
                local_3d8._24_8_ = pQVar34->name;
                local_3d8._0_4_ = 2;
                local_3d8._4_4_ = 0;
                local_3d8._8_4_ = 0;
                local_3d8._12_4_ = 0;
                local_3d8._16_4_ = 0;
                local_3d8._20_4_ = 0;
                pcStack_520 = (code *)0x438ca8;
                QMessageLogger::debug();
                pDVar15 = local_4d8.d;
                pcStack_520 = (code *)0x438cc7;
                QVar61.m_data = (storage_type *)0x7;
                QVar61.m_size = (qsizetype)&local_418;
                QString::fromUtf8(QVar61);
                pcStack_520 = (code *)0x438cd2;
                QTextStream::operator<<((QTextStream *)pDVar15,(QString *)&local_418);
                if ((QWidget *)local_418.d.d != (QWidget *)0x0) {
                  LOCK();
                  *(int *)local_418.d.d = *(int *)local_418.d.d + -1;
                  UNLOCK();
                  if (*(int *)local_418.d.d == 0) {
                    pcStack_520 = (code *)0x438cf7;
                    QArrayData::deallocate(&(local_418.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((char)local_4d8.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>.
                          _M_i == '\x01') {
                  pcStack_520 = (code *)0x438d0c;
                  QTextStream::operator<<((QTextStream *)local_4d8.d,' ');
                }
                local_4b8 = &(local_4d8.d)->super_QArrayData;
                *(int *)&local_4d8.d[2].super_QArrayData.alloc =
                     (int)local_4d8.d[2].super_QArrayData.alloc + 1;
                pcStack_520 = (code *)0x438d31;
                ::operator<<((Stream *)local_4b0,(QWidget *)&local_4b8);
                pcStack_520 = (code *)0x438d39;
                QDebug::~QDebug((QDebug *)local_4b0);
                pcStack_520 = (code *)0x438d41;
                QDebug::~QDebug((QDebug *)&local_4b8);
                pcStack_520 = (code *)0x438d4b;
                QDebug::~QDebug((QDebug *)&local_4d8);
              }
            }
            pcStack_520 = (code *)0x438d5a;
            pQVar35 = (QDockWidgetGroupWindow *)
                      QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
            pcStack_520 = (code *)0x438d68;
            QVar40 = QWidget::mapFromGlobal((QWidget *)pQVar35,pos_00);
            local_3d8._0_4_ = QVar40.xp.m_i;
            local_3d8._4_4_ = QVar40.yp.m_i;
            pcStack_520 = (code *)0x438d7e;
            bVar19 = QDockWidgetGroupWindow::hover
                               ((QDockWidgetGroupWindow *)pQVar35,pQVar44,(QPoint *)local_3d8);
            if (bVar19) {
              pcStack_520 = (code *)0x438d8d;
              setCurrentHoveredFloat(this,pQVar35);
              pcStack_520 = (code *)0x438da1;
              applyState(this,(QMainWindowLayoutState *)(this + 0x88),true);
            }
            if (local_4e8 != (QArrayData *)0x0) {
              LOCK();
              (local_4e8->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_4e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_4e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                pcStack_520 = (code *)0x438dbf;
                QArrayData::deallocate(local_4e8,8,0x10);
              }
            }
            if (local_90 != &local_88) {
              pcStack_520 = (code *)0x438de9;
              QtPrivate::sizedFree(local_90,(long)local_a0 << 3);
            }
            goto LAB_00437302;
          }
        }
        lVar28 = lVar28 + 8;
      } while (lVar45 != lVar28);
    }
    if (local_4e8 != (QArrayData *)0x0) {
      LOCK();
      (local_4e8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_4e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_4e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pcStack_520 = (code *)0x437679;
        QArrayData::deallocate(local_4e8,8,0x10);
      }
    }
    mousePos = local_4f0;
    pQVar27 = local_510;
    if (local_90 != &local_88) {
      pcStack_520 = (code *)0x4376a9;
      QtPrivate::sizedFree(local_90,(long)local_a0 << 3);
    }
  }
LAB_004376a9:
  if ((*(long *)(this + 0x7f0) != 0) &&
     (*(QDockWidgetGroupWindow **)(this + 0x7f8) != (QDockWidgetGroupWindow *)0x0 &&
      *(int *)(*(long *)(this + 0x7f0) + 4) != 0)) {
    pcStack_520 = (code *)0x4376d9;
    QDockWidgetGroupWindow::destroyIfSingleItemLeft(*(QDockWidgetGroupWindow **)(this + 0x7f8));
  }
  pcStack_520 = (code *)0x4376e3;
  setCurrentHoveredFloat(this,(QDockWidgetGroupWindow *)0x0);
  local_4f8 = (QMainWindowLayoutState *)(this + 0x88);
  local_508 = this + 0x1a0;
  this[0x3a4] = (QMainWindowLayout)0x0;
  local_4c0 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_520 = (code *)0x437719;
  pQVar29 = QLayout::parentWidget((QLayout *)this);
  pcStack_520 = (code *)0x437724;
  local_4c0 = QWidget::mapFromGlobal(pQVar29,mousePos);
  pQVar1 = (QMainWindowLayoutState *)(this + 0x3c0);
  if ((*(int *)(this + 0x3c8) < *(int *)(this + 0x3c0)) ||
     (*(int *)(this + 0x3cc) < *(int *)(this + 0x3c4))) {
    *(QMainWindow **)(this + 0x3d0) = local_4f8->mainWindow;
    RVar14.m_i = (local_4f8->rect).y1.m_i;
    qVar3 = *(qsizetype *)&(local_4f8->rect).x2;
    (pQVar1->rect).x1 = (Representation)(local_4f8->rect).x1.m_i;
    (pQVar1->rect).y1 = (Representation)RVar14.m_i;
    *(qsizetype *)(this + 0x3c8) = qVar3;
    *(undefined8 *)(this + 1000) = *(undefined8 *)(this + 0xb0);
    *(undefined8 *)(this + 0x3d8) = *(undefined8 *)(this + 0xa0);
    *(undefined8 *)(this + 0x3e0) = *(undefined8 *)(this + 0xa8);
    this_02 = (QArrayDataPointer<QToolBarAreaLayoutLine> *)(this + 0x3f0);
    lVar28 = 4;
    do {
      pcStack_520 = (code *)0x43779c;
      QArrayDataPointer<QToolBarAreaLayoutLine>::operator=
                (this_02,(QArrayDataPointer<QToolBarAreaLayoutLine> *)&this_02[-0x23].size);
      uVar4 = *(undefined8 *)((long)&this_02[-0x21].d + 1);
      uVar5 = *(undefined8 *)((long)&this_02[-0x21].ptr + 1);
      this_02[1].d = (Data *)this_02[-0x22].size;
      this_02[1].ptr = (QToolBarAreaLayoutLine *)this_02[-0x21].d;
      *(undefined8 *)((long)&this_02[1].ptr + 1) = uVar4;
      *(undefined8 *)((long)&this_02[1].size + 1) = uVar5;
      this_02 = (QArrayDataPointer<QToolBarAreaLayoutLine> *)&this_02[2].ptr;
      lVar28 = lVar28 + -1;
    } while (lVar28 != 0);
    this[0x4d0] = this[0x198];
    uVar4 = *(undefined8 *)(local_508 + 8);
    uVar5 = *(undefined8 *)(local_508 + 0x10);
    uVar6 = *(undefined8 *)(local_508 + 0x18);
    uVar7 = *(undefined8 *)(local_508 + 0x20);
    uVar8 = *(undefined8 *)(local_508 + 0x28);
    uVar9 = *(undefined8 *)(local_508 + 0x30);
    uVar10 = *(undefined8 *)(local_508 + 0x38);
    *(undefined8 *)(this + 0x4d8) = *(undefined8 *)local_508;
    *(undefined8 *)(this + 0x4e0) = uVar4;
    *(undefined8 *)(this + 0x4e8) = uVar5;
    *(undefined8 *)(this + 0x4f0) = uVar6;
    *(undefined8 *)(this + 0x4f8) = uVar7;
    *(undefined8 *)(this + 0x500) = uVar8;
    *(undefined8 *)(this + 0x508) = uVar9;
    *(undefined8 *)(this + 0x510) = uVar10;
    lVar28 = 0;
    do {
      *(undefined8 *)(this + lVar28 + 0x518) = *(undefined8 *)(this + lVar28 + 0x1e0);
      pcStack_520 = (code *)0x43782a;
      QArrayDataPointer<QWidget_*>::operator=
                ((QArrayDataPointer<QWidget_*> *)(this + lVar28 + 0x520),
                 (QArrayDataPointer<QWidget_*> *)(this + lVar28 + 0x1e8));
      *(undefined8 *)(this + lVar28 + 0x538) = *(undefined8 *)(this + lVar28 + 0x200);
      *(undefined8 *)(this + lVar28 + 0x540) = *(undefined8 *)(this + lVar28 + 0x208);
      *(undefined8 *)(this + lVar28 + 0x548) = *(undefined8 *)(this + lVar28 + 0x210);
      *(undefined8 *)(this + lVar28 + 0x550) = *(undefined8 *)(this + lVar28 + 0x218);
      pQVar41 = (QArrayDataPointer<QDockAreaLayoutItem> *)(this + lVar28 + 0x558);
      pcStack_520 = (code *)0x43785e;
      QArrayDataPointer<QDockAreaLayoutItem>::operator=
                (pQVar41,(QArrayDataPointer<QDockAreaLayoutItem> *)(this + lVar28 + 0x220));
      pQVar11 = *(QDockAreaLayoutItem **)(this + lVar28 + 0x240);
      pQVar41[1].d = *(Data **)(this + lVar28 + 0x238);
      pQVar41[1].ptr = pQVar11;
      *(undefined4 *)&pQVar41[1].size = *(undefined4 *)(this + lVar28 + 0x248);
      lVar28 = lVar28 + 0x70;
    } while (lVar28 != 0x1c0);
    this[0x6dc] = this[0x3a4];
    *(undefined4 *)(this + 0x6d8) = *(undefined4 *)(this + 0x3a0);
    pcStack_520 = (code *)0x4378ae;
    QArrayDataPointer<QWidget_*>::operator=
              ((QArrayDataPointer<QWidget_*> *)(this + 0x6e0),
               (QArrayDataPointer<QWidget_*> *)(this + 0x3a8));
    pQVar27 = local_510;
  }
  local_4d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_4d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_4d8.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_520 = (code *)0x4378da;
  QMainWindowLayoutState::gapIndex((QList<int> *)&local_4d8,pQVar1,pQVar27,&local_4c0);
  if ((undefined1 *)local_4d8.size == (undefined1 *)0x0) {
    puVar37 = (undefined1 *)0x0;
  }
  else {
    pcStack_520 = (code *)0x4378ee;
    DVar22 = QDockWidgetPrivate::toDockWidgetArea(local_4d8.ptr[1]);
    pcStack_520 = (code *)0x437900;
    pQVar33 = (QDockWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
    if (pQVar33 == (QDockWidget *)0x0) {
      pcStack_520 = (code *)0x43794b;
      lVar28 = QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
      if (lVar28 == 0) {
        pcStack_520 = (code *)0x437e1b;
        pQVar34 = QtPrivateLogging::lcQpaDockWidgets();
        if (((pQVar34->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
          local_3d8._24_8_ = pQVar34->name;
          local_3d8._0_4_ = 2;
          local_3d8._4_4_ = 0;
          local_3d8._8_4_ = 0;
          local_3d8._12_4_ = 0;
          local_3d8._16_4_ = 0;
          local_3d8._20_4_ = 0;
          pcStack_520 = (code *)0x437e5b;
          QMessageLogger::debug();
          pDVar17 = local_418.d.d;
          pcStack_520 = (code *)0x437e7a;
          QVar51.m_data = (storage_type *)0x39;
          QVar51.m_size = (qsizetype)local_a0;
          QString::fromUtf8(QVar51);
          pcStack_520 = (code *)0x437e85;
          QTextStream::operator<<((QTextStream *)pDVar17,(QString *)local_a0);
          if (local_a0 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)local_a0 = *(int *)local_a0 + -1;
            UNLOCK();
            if (*(int *)local_a0 == 0) {
              pcStack_520 = (code *)0x437eaa;
              QArrayData::deallocate((QArrayData *)local_a0,2,0x10);
            }
          }
          if (((QWidget *)((long)local_418.d.d + 0x28))->field_0x8 == '\x01') {
            pcStack_520 = (code *)0x437ec2;
            QTextStream::operator<<((QTextStream *)local_418.d.d,' ');
          }
          local_480._0_8_ = local_418.d.d;
          *(int *)((long)local_418.d.d + 0x28) = *(int *)((long)local_418.d.d + 0x28) + 1;
          pcStack_520 = (code *)0x437eeb;
          ::operator<<((Stream *)(local_480 + 8),(QWidget *)local_480);
          local_a0 = (undefined1  [8])local_480._8_8_;
          *(int *)&((QPalette *)(local_480._8_8_ + 0x28))->d =
               *(int *)&((QPalette *)(local_480._8_8_ + 0x28))->d + 1;
          pcStack_520 = (code *)0x437f21;
          qt_QMetaEnum_flagDebugOperator
                    (&local_470,(ulonglong)local_a0,(QMetaObject *)(ulong)DVar22,
                     (char *)&Qt::staticMetaObject);
          pcStack_520 = (code *)0x437f29;
          QDebug::~QDebug((QDebug *)local_a0);
          pcStack_520 = (code *)0x437f31;
          QDebug::~QDebug(&local_470);
          pcStack_520 = (code *)0x437f39;
          QDebug::~QDebug((QDebug *)(local_480 + 8));
          pcStack_520 = (code *)0x437f46;
          QDebug::~QDebug((QDebug *)local_480);
          this_01 = &local_418;
          goto LAB_00437f4e;
        }
        goto LAB_00437f53;
      }
      local_418.d.d = (Data *)0x0;
      local_418.d.ptr = (QDockWidget **)0x0;
      local_418.d.size = 0;
      pcStack_520 = (code *)0x43798c;
      qt_qFindChildren_helper
                (lVar28,0,0x8000000000000000,&QDockWidget::staticMetaObject,&local_418,0);
      if (local_418.d.size == 1) {
        pcStack_520 = (code *)0x4379a7;
        DVar23 = QDockWidget::allowedAreas((QDockWidget *)*(WId *)local_418.d.ptr);
        bVar19 = true;
        if ((DVar22 & ~(uint)DVar23.super_QFlagsStorageHelper<Qt::DockWidgetArea,_4>.
                             super_QFlagsStorage<Qt::DockWidgetArea>.i) != NoDockWidgetArea) {
          pcStack_520 = (code *)0x4379ba;
          pQVar34 = QtPrivateLogging::lcQpaDockWidgets();
          if (((pQVar34->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
            local_3d8._24_8_ = pQVar34->name;
            local_3d8._0_4_ = 2;
            local_3d8._4_4_ = 0;
            local_3d8._8_4_ = 0;
            local_3d8._12_4_ = 0;
            local_3d8._16_4_ = 0;
            local_3d8._20_4_ = 0;
            pcStack_520 = (code *)0x4379fd;
            QMessageLogger::debug();
            QVar16.stream = local_438.stream;
            pcStack_520 = (code *)0x437a1c;
            QVar47.m_data = (storage_type *)0x27;
            QVar47.m_size = (qsizetype)local_a0;
            QString::fromUtf8(QVar47);
            pcStack_520 = (code *)0x437a27;
            QTextStream::operator<<((QTextStream *)QVar16.stream,(QString *)local_a0);
            if (local_a0 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)local_a0 = *(int *)local_a0 + -1;
              UNLOCK();
              if (*(int *)local_a0 == 0) {
                pcStack_520 = (code *)0x437a4c;
                QArrayData::deallocate((QArrayData *)local_a0,2,0x10);
              }
            }
            if (*(QTextStream *)(local_438.stream + 0x30) == (QTextStream)0x1) {
              pcStack_520 = (code *)0x437a69;
              QTextStream::operator<<((QTextStream *)local_438.stream,' ');
            }
            *(int *)((long)local_438.stream + 0x28) = *(int *)((long)local_438.stream + 0x28) + 1;
            pcStack_520 = (code *)0x437a92;
            ::operator<<((Stream *)local_3f8,(QWidget *)local_430);
            uVar4 = local_3f8._0_8_;
            pcStack_520 = (code *)0x437ab1;
            QVar48.m_data = &DAT_0000000a;
            QVar48.m_size = (qsizetype)local_a0;
            QString::fromUtf8(QVar48);
            pcStack_520 = (code *)0x437abc;
            QTextStream::operator<<((QTextStream *)uVar4,(QString *)local_a0);
            if (local_a0 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)local_a0 = *(int *)local_a0 + -1;
              UNLOCK();
              if (*(int *)local_a0 == 0) {
                pcStack_520 = (code *)0x437ae1;
                QArrayData::deallocate((QArrayData *)local_a0,2,0x10);
              }
            }
            if (*(Stream *)(local_3f8._0_8_ + 0x30) == (Stream)0x1) {
              pcStack_520 = (code *)0x437af9;
              QTextStream::operator<<((QTextStream *)local_3f8._0_8_,' ');
            }
            *(int *)(local_3f8._0_8_ + 0x28) = *(int *)(local_3f8._0_8_ + 0x28) + 2;
            pcStack_520 = (code *)0x437b45;
            local_a0 = (undefined1  [8])local_3f8._0_8_;
            qt_QMetaEnum_flagDebugOperator
                      (&local_420,(ulonglong)local_a0,(QMetaObject *)(ulong)DVar22,
                       (char *)&Qt::staticMetaObject);
            pcStack_520 = (code *)0x437b4d;
            QDebug::~QDebug((QDebug *)local_a0);
            pcStack_520 = (code *)0x437b55;
            QDebug::~QDebug(&local_420);
            pcStack_520 = (code *)0x437b5d;
            QDebug::~QDebug((QDebug *)(local_430 + 8));
            pcStack_520 = (code *)0x437b6a;
            QDebug::~QDebug((QDebug *)local_3f8);
            pcStack_520 = (code *)0x437b77;
            QDebug::~QDebug((QDebug *)local_430);
            pcStack_520 = (code *)0x437b84;
            QDebug::~QDebug(&local_438);
          }
          bVar19 = false;
        }
      }
      else {
        pcStack_520 = (code *)0x4383e5;
        pQVar34 = QtPrivateLogging::lcQpaDockWidgets();
        if (((pQVar34->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
          local_3d8._24_8_ = pQVar34->name;
          local_3d8._0_4_ = 2;
          local_3d8._4_4_ = 0;
          local_3d8._8_4_ = 0;
          local_3d8._12_4_ = 0;
          local_3d8._16_4_ = 0;
          local_3d8._20_4_ = 0;
          pcStack_520 = (code *)0x438425;
          QMessageLogger::debug();
          QVar16.stream = local_438.stream;
          pcStack_520 = (code *)0x438444;
          QVar52.m_data = (storage_type *)0x15;
          QVar52.m_size = (qsizetype)local_a0;
          QString::fromUtf8(QVar52);
          pcStack_520 = (code *)0x43844f;
          QTextStream::operator<<((QTextStream *)QVar16.stream,(QString *)local_a0);
          if (local_a0 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)local_a0 = *(int *)local_a0 + -1;
            UNLOCK();
            if (*(int *)local_a0 == 0) {
              pcStack_520 = (code *)0x438474;
              QArrayData::deallocate((QArrayData *)local_a0,2,0x10);
            }
          }
          if (*(QTextStream *)(local_438.stream + 0x30) == (QTextStream)0x1) {
            pcStack_520 = (code *)0x43848c;
            QTextStream::operator<<((QTextStream *)local_438.stream,' ');
          }
          local_440 = (undefined1  [8])local_438.stream;
          *(int *)(local_438.stream + 0x28) = *(int *)(local_438.stream + 0x28) + 1;
          pcStack_520 = (code *)0x4384b5;
          ::operator<<((Stream *)local_3f8,(QWidget *)local_440);
          uVar4 = local_3f8._0_8_;
          pcStack_520 = (code *)0x4384d4;
          QVar53.m_data = (storage_type *)0x3;
          QVar53.m_size = (qsizetype)local_a0;
          QString::fromUtf8(QVar53);
          pcStack_520 = (code *)0x4384df;
          QTextStream::operator<<((QTextStream *)uVar4,(QString *)local_a0);
          if (local_a0 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)local_a0 = *(int *)local_a0 + -1;
            UNLOCK();
            if (*(int *)local_a0 == 0) {
              pcStack_520 = (code *)0x438504;
              QArrayData::deallocate((QArrayData *)local_a0,2,0x10);
            }
          }
          if (*(Stream *)(local_3f8._0_8_ + 0x30) == (Stream)0x1) {
            pcStack_520 = (code *)0x43851c;
            QTextStream::operator<<((QTextStream *)local_3f8._0_8_,' ');
          }
          pcStack_520 = (code *)0x438531;
          QTextStream::operator<<((QTextStream *)local_3f8._0_8_,local_418.d.size);
          if (*(Stream *)(local_3f8._0_8_ + 0x30) == (Stream)0x1) {
            pcStack_520 = (code *)0x43854d;
            QTextStream::operator<<((QTextStream *)local_3f8._0_8_,' ');
          }
          uVar4 = local_3f8._0_8_;
          pcStack_520 = (code *)0x438571;
          QVar54.m_data = (storage_type *)0x9;
          QVar54.m_size = (qsizetype)local_a0;
          QString::fromUtf8(QVar54);
          pcStack_520 = (code *)0x43857c;
          QTextStream::operator<<((QTextStream *)uVar4,(QString *)local_a0);
          if (local_a0 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)local_a0 = *(int *)local_a0 + -1;
            UNLOCK();
            if (*(int *)local_a0 == 0) {
              pcStack_520 = (code *)0x4385a1;
              QArrayData::deallocate((QArrayData *)local_a0,2,0x10);
            }
          }
          if (*(Stream *)(local_3f8._0_8_ + 0x30) == (Stream)0x1) {
            pcStack_520 = (code *)0x4385b9;
            QTextStream::operator<<((QTextStream *)local_3f8._0_8_,' ');
          }
          pcStack_520 = (code *)0x4385c6;
          QDebug::~QDebug((QDebug *)local_3f8);
          pcStack_520 = (code *)0x4385d3;
          QDebug::~QDebug((QDebug *)local_440);
          pcStack_520 = (code *)0x4385e0;
          QDebug::~QDebug(&local_438);
        }
        pcStack_520 = (code *)0x4385e5;
        pQVar34 = QtPrivateLogging::lcQpaDockWidgets();
        if (((pQVar34->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
          local_3d8._24_8_ = pQVar34->name;
          local_3d8._0_4_ = 2;
          local_3d8._4_4_ = 0;
          local_3d8._8_4_ = 0;
          local_3d8._12_4_ = 0;
          local_3d8._16_4_ = 0;
          local_3d8._20_4_ = 0;
          pcStack_520 = (code *)0x438625;
          QMessageLogger::debug();
          local_a0 = (undefined1  [8])local_450.stream;
          local_450.stream = (Stream *)0x0;
          pcStack_520 = (code *)0x43865d;
          QtPrivate::printSequentialContainer<QList<QDockWidget*>>
                    (local_448,(Stream *)local_a0,"QList",&local_418);
          pcStack_520 = (code *)0x438665;
          QDebug::~QDebug((QDebug *)local_a0);
          pcStack_520 = (code *)0x43866d;
          QDebug::~QDebug((QDebug *)local_448);
          pcStack_520 = (code *)0x438675;
          QDebug::~QDebug(&local_450);
        }
        pcStack_520 = (code *)0x43867a;
        pQVar34 = QtPrivateLogging::lcQpaDockWidgets();
        bVar19 = true;
        if (((pQVar34->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
          local_3d8._24_8_ = pQVar34->name;
          local_3d8._0_4_ = 2;
          local_3d8._4_4_ = 0;
          local_3d8._8_4_ = 0;
          local_3d8._12_4_ = 0;
          local_3d8._16_4_ = 0;
          local_3d8._20_4_ = 0;
          pcStack_520 = (code *)0x4386bd;
          QMessageLogger::debug();
          QVar16.stream = local_468.stream;
          pcStack_520 = (code *)0x4386dc;
          QVar55.m_data = (storage_type *)0x15;
          QVar55.m_size = (qsizetype)local_a0;
          QString::fromUtf8(QVar55);
          pcStack_520 = (code *)0x4386e7;
          QTextStream::operator<<((QTextStream *)QVar16.stream,(QString *)local_a0);
          if (local_a0 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)local_a0 = *(int *)local_a0 + -1;
            UNLOCK();
            if (*(int *)local_a0 == 0) {
              pcStack_520 = (code *)0x43870c;
              QArrayData::deallocate((QArrayData *)local_a0,2,0x10);
            }
          }
          if (*(QTextStream *)(local_468.stream + 0x30) == (QTextStream)0x1) {
            pcStack_520 = (code *)0x438724;
            QTextStream::operator<<((QTextStream *)local_468.stream,' ');
          }
          *(int *)((QTextStream *)local_468.stream + 0x28) =
               *(int *)((QTextStream *)local_468.stream + 0x28) + 1;
          pcStack_520 = (code *)0x43874f;
          ::operator<<((Stream *)&local_438,(QWidget *)local_460);
          QVar16.stream = local_438.stream;
          pcStack_520 = (code *)0x43876e;
          QVar56.m_data = &DAT_0000000b;
          QVar56.m_size = (qsizetype)local_a0;
          QString::fromUtf8(QVar56);
          pcStack_520 = (code *)0x438779;
          QTextStream::operator<<((QTextStream *)QVar16.stream,(QString *)local_a0);
          if (local_a0 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)local_a0 = *(int *)local_a0 + -1;
            UNLOCK();
            if (*(int *)local_a0 == 0) {
              pcStack_520 = (code *)0x43879e;
              QArrayData::deallocate((QArrayData *)local_a0,2,0x10);
            }
          }
          if (*(QTextStream *)(local_438.stream + 0x30) == (QTextStream)0x1) {
            pcStack_520 = (code *)0x4387b6;
            QTextStream::operator<<((QTextStream *)local_438.stream,' ');
          }
          *(int *)((long)local_438.stream + 0x28) = *(int *)((long)local_438.stream + 0x28) + 2;
          pcStack_520 = (code *)0x4387fe;
          local_a0 = (undefined1  [8])local_438.stream;
          qt_QMetaEnum_flagDebugOperator
                    ((QDebug *)local_3f8,(ulonglong)local_a0,(QMetaObject *)(ulong)DVar22,
                     (char *)&Qt::staticMetaObject);
          pcStack_520 = (code *)0x438806;
          QDebug::~QDebug((QDebug *)local_a0);
          uVar4 = local_3f8._0_8_;
          pcStack_520 = (code *)0x438826;
          QVar57.m_data = (storage_type *)0x12;
          QVar57.m_size = (qsizetype)local_a0;
          QString::fromUtf8(QVar57);
          pcStack_520 = (code *)0x438831;
          QTextStream::operator<<((QTextStream *)uVar4,(QString *)local_a0);
          if (local_a0 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)local_a0 = *(int *)local_a0 + -1;
            UNLOCK();
            if (*(int *)local_a0 == 0) {
              pcStack_520 = (code *)0x438856;
              QArrayData::deallocate((QArrayData *)local_a0,2,0x10);
            }
          }
          if (*(Stream *)(local_3f8._0_8_ + 0x30) == (Stream)0x1) {
            pcStack_520 = (code *)0x43886e;
            QTextStream::operator<<((QTextStream *)local_3f8._0_8_,' ');
          }
          pcStack_520 = (code *)0x43887b;
          QDebug::~QDebug((QDebug *)local_3f8);
          pcStack_520 = (code *)0x438888;
          QDebug::~QDebug((QDebug *)(local_460 + 8));
          pcStack_520 = (code *)0x438895;
          QDebug::~QDebug(&local_438);
          pcStack_520 = (code *)0x4388a2;
          QDebug::~QDebug((QDebug *)local_460);
          pcStack_520 = (code *)0x4388af;
          QDebug::~QDebug(&local_468);
        }
      }
      if ((QWidget *)local_418.d.d != (QWidget *)0x0) {
        LOCK();
        *(int *)local_418.d.d = *(int *)local_418.d.d + -1;
        UNLOCK();
        if (*(int *)local_418.d.d == 0) {
          pcStack_520 = (code *)0x4388e0;
          QArrayData::deallocate(&(local_418.d.d)->super_QArrayData,8,0x10);
        }
      }
LAB_00437f56:
      pcStack_520 = (code *)0x437f67;
      this_00 = (QToolBar *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
      if (this_00 != (QToolBar *)0x0) goto LAB_00437f70;
      puVar37 = (undefined1 *)local_4d8.size;
      if (bVar19) goto LAB_00437fae;
    }
    else {
      pcStack_520 = (code *)0x43790d;
      DVar23 = QDockWidget::allowedAreas(pQVar33);
      if ((DVar22 & ~(uint)DVar23.super_QFlagsStorageHelper<Qt::DockWidgetArea,_4>.
                           super_QFlagsStorage<Qt::DockWidgetArea>.i) != NoDockWidgetArea) {
        pcStack_520 = (code *)0x437b91;
        pQVar34 = QtPrivateLogging::lcQpaDockWidgets();
        if (((pQVar34->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
          local_3d8._24_8_ = pQVar34->name;
          local_3d8._0_4_ = 2;
          local_3d8._4_4_ = 0;
          local_3d8._8_4_ = 0;
          local_3d8._12_4_ = 0;
          local_3d8._16_4_ = 0;
          local_3d8._20_4_ = 0;
          pcStack_520 = (code *)0x437bd1;
          QMessageLogger::debug();
          uVar4 = local_3f8._0_8_;
          pcStack_520 = (code *)0x437bf0;
          QVar49.m_data = (storage_type *)0x23;
          QVar49.m_size = (qsizetype)local_a0;
          QString::fromUtf8(QVar49);
          pcStack_520 = (code *)0x437bfb;
          QTextStream::operator<<((QTextStream *)uVar4,(QString *)local_a0);
          if (local_a0 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)local_a0 = *(int *)local_a0 + -1;
            UNLOCK();
            if (*(int *)local_a0 == 0) {
              pcStack_520 = (code *)0x437c20;
              QArrayData::deallocate((QArrayData *)local_a0,2,0x10);
            }
          }
          if (*(Stream *)(local_3f8._0_8_ + 0x30) == (Stream)0x1) {
            pcStack_520 = (code *)0x437c38;
            QTextStream::operator<<((QTextStream *)local_3f8._0_8_,' ');
          }
          *(int *)(local_3f8._0_8_ + 0x28) = *(int *)(local_3f8._0_8_ + 0x28) + 1;
          pcStack_520 = (code *)0x437c61;
          ::operator<<((Stream *)&local_418,(QWidget *)(local_3f8 + 8));
          pDVar17 = local_418.d.d;
          pcStack_520 = (code *)0x437c80;
          QVar50.m_data = &DAT_0000000a;
          QVar50.m_size = (qsizetype)local_a0;
          QString::fromUtf8(QVar50);
          pcStack_520 = (code *)0x437c8b;
          QTextStream::operator<<((QTextStream *)pDVar17,(QString *)local_a0);
          if (local_a0 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)local_a0 = *(int *)local_a0 + -1;
            UNLOCK();
            if (*(int *)local_a0 == 0) {
              pcStack_520 = (code *)0x437cb0;
              QArrayData::deallocate((QArrayData *)local_a0,2,0x10);
            }
          }
          if (((QWidget *)((long)local_418.d.d + 0x28))->field_0x8 == '\x01') {
            pcStack_520 = (code *)0x437cc8;
            QTextStream::operator<<((QTextStream *)local_418.d.d,' ');
          }
          local_3e8.stream = (Stream *)local_418.d.d;
          local_a0 = (undefined1  [8])local_418.d.d;
          *(int *)((long)local_418.d.d + 0x28) = *(int *)((long)local_418.d.d + 0x28) + 2;
          pcStack_520 = (code *)0x437d14;
          qt_QMetaEnum_flagDebugOperator
                    (&local_3e0,(ulonglong)local_a0,(QMetaObject *)(ulong)DVar22,
                     (char *)&Qt::staticMetaObject);
          pcStack_520 = (code *)0x437d1c;
          QDebug::~QDebug((QDebug *)local_a0);
          pcStack_520 = (code *)0x437d24;
          QDebug::~QDebug(&local_3e0);
          pcStack_520 = (code *)0x437d2c;
          QDebug::~QDebug(&local_3e8);
          pcStack_520 = (code *)0x437d39;
          QDebug::~QDebug((QDebug *)&local_418);
          pcStack_520 = (code *)0x437d46;
          QDebug::~QDebug((QDebug *)(local_3f8 + 8));
          this_01 = (QList<QDockWidget_*> *)local_3f8;
LAB_00437f4e:
          pcStack_520 = (code *)0x437f53;
          QDebug::~QDebug((QDebug *)this_01);
        }
LAB_00437f53:
        bVar19 = false;
        goto LAB_00437f56;
      }
      pcStack_520 = (code *)0x437927;
      this_00 = (QToolBar *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
      puVar37 = (undefined1 *)local_4d8.size;
      if (this_00 == (QToolBar *)0x0) goto LAB_00437fae;
LAB_00437f70:
      uVar25 = 0xffffffff;
      if ((ulong)(uint)local_4d8.ptr[1] < 4) {
        uVar25 = *(uint *)(&DAT_006d9480 + (ulong)(uint)local_4d8.ptr[1] * 4);
      }
      pcStack_520 = (code *)0x437f97;
      TVar26 = QToolBar::allowedAreas(this_00);
      puVar37 = (undefined1 *)local_4d8.size;
      if (((uint)TVar26.super_QFlagsStorageHelper<Qt::ToolBarArea,_4>.
                 super_QFlagsStorage<Qt::ToolBarArea>.i | uVar25) == 0xffffffff) goto LAB_00437fae;
    }
    pcStack_520 = (code *)0x437fa9;
    QList<int>::clear((QList<int> *)&local_4d8);
    puVar37 = (undefined1 *)local_4d8.size;
  }
LAB_00437fae:
  if (puVar37 == *(undefined1 **)(this + 0x7c0)) {
    if ((local_4d8.ptr != *(int **)(this + 0x7b8)) && (puVar37 != (undefined1 *)0x0)) {
      lVar28 = 0;
      do {
        if (*(int *)((long)local_4d8.ptr + lVar28) !=
            *(int *)((long)*(int **)(this + 0x7b8) + lVar28)) goto LAB_00437ff1;
        lVar28 = lVar28 + 4;
      } while ((long)puVar37 * 4 != lVar28);
    }
  }
  else {
LAB_00437ff1:
    pcStack_520 = (code *)0x438008;
    QArrayDataPointer<int>::operator=((QArrayDataPointer<int> *)(this + 0x7b0),&local_4d8);
    if ((undefined1 *)local_4d8.size == (undefined1 *)0x0) {
      pcStack_520 = (code *)0x438395;
      fixToolBarOrientation(local_500,2);
      pcStack_520 = (code *)0x4383a2;
      restore(this,true);
    }
    else {
      pcStack_520 = (code *)0x438027;
      fixToolBarOrientation(local_500,*(int *)(*(long *)(this + 0x7b8) + 4));
      local_3d8._16_4_ = (undefined4)*(undefined8 *)(this + 0x3d0);
      local_3d8._20_4_ = (undefined4)((ulong)*(undefined8 *)(this + 0x3d0) >> 0x20);
      uVar12 = (pQVar1->rect).x1;
      uVar13 = (pQVar1->rect).y1;
      local_3d8._8_4_ = (undefined4)*(undefined8 *)(this + 0x3c8);
      local_3d8._12_4_ = (undefined4)((ulong)*(undefined8 *)(this + 0x3c8) >> 0x20);
      pcStack_520 = (code *)0x438052;
      local_3d8._0_4_ = uVar12;
      local_3d8._4_4_ = uVar13;
      memset(local_3a8,0xaa,0x308);
      local_3d8._24_8_ = *(undefined8 *)(this + 0x3d8);
      local_3d8._32_8_ = *(undefined8 *)(this + 0x3e0);
      local_3b0 = *(QMainWindow **)(this + 1000);
      lVar28 = 0x408;
      do {
        piVar2 = *(int **)(this + lVar28 + -0x18);
        *(int **)((long)auStack_7b0 + lVar28) = piVar2;
        *(undefined8 *)((long)auStack_7b0 + lVar28 + 8) = *(undefined8 *)(this + lVar28 + -0x10);
        *(undefined8 *)((long)auStack_7b0 + lVar28 + 0x10) = *(undefined8 *)(this + lVar28 + -8);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        uVar4 = *(undefined8 *)(this + lVar28);
        uVar5 = *(undefined8 *)(this + lVar28 + 8);
        uVar6 = *(undefined8 *)(this + lVar28 + 9 + 8);
        *(undefined8 *)(auStack_78f + lVar28) = *(undefined8 *)(this + lVar28 + 9);
        *(undefined8 *)(auStack_787 + lVar28) = uVar6;
        *(undefined8 *)((long)auStack_7b0 + lVar28 + 0x18) = uVar4;
        *(undefined8 *)(&stack0xfffffffffffff870 + lVar28) = uVar5;
        lVar28 = lVar28 + 0x38;
      } while (lVar28 != 0x4e8);
      local_2c8 = this[0x4d0];
      local_2c0 = *(DockWidgetArea (*) [2])(this + 0x4d8);
      aDStack_2b8 = *(DockWidgetArea (*) [2])(this + 0x4e0);
      local_2b0._0_8_ = *(undefined8 *)(this + 0x4e8);
      local_2b0._8_8_ = *(undefined8 *)(this + 0x4f0);
      local_2a0 = *(QLayoutItem **)(this + 0x4f8);
      pQStack_298 = *(QMainWindow **)(this + 0x500);
      local_290[0]._0_8_ = *(undefined8 *)(this + 0x508);
      local_290[0]._8_8_ = *(undefined8 *)(this + 0x510);
      lVar28 = 0x518;
      do {
        *(undefined8 *)((long)auStack_7b0 + lVar28 + 0x18) = *(undefined8 *)(this + lVar28);
        piVar2 = *(int **)(this + lVar28 + 8);
        *(int **)(&stack0xfffffffffffff870 + lVar28) = piVar2;
        *(undefined8 *)(auStack_78f + lVar28 + 7) = *(undefined8 *)(this + lVar28 + 0x10);
        *(undefined8 *)(auStack_787 + lVar28 + 7) = *(undefined8 *)(this + lVar28 + 0x18);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        uVar4 = *(undefined8 *)(this + lVar28 + 0x20);
        uVar5 = *(undefined8 *)(this + lVar28 + 0x20 + 8);
        uVar6 = *(undefined8 *)(this + lVar28 + 0x30 + 8);
        *(undefined8 *)((long)auStack_778 + lVar28 + 0x10) = *(undefined8 *)(this + lVar28 + 0x30);
        *(undefined8 *)((long)auStack_778 + lVar28 + 0x18) = uVar6;
        *(undefined8 *)((long)auStack_778 + lVar28) = uVar4;
        *(undefined8 *)((long)auStack_778 + lVar28 + 8) = uVar5;
        piVar2 = *(int **)(this + lVar28 + 0x40);
        *(int **)((long)auStack_778 + lVar28 + 0x20) = piVar2;
        *(undefined8 *)((long)auStack_778 + lVar28 + 0x28) = *(undefined8 *)(this + lVar28 + 0x48);
        *(undefined8 *)((long)auStack_778 + lVar28 + 0x30) = *(undefined8 *)(this + lVar28 + 0x50);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        *(undefined4 *)((long)auStack_730 + lVar28) = *(undefined4 *)(this + lVar28 + 0x68);
        uVar4 = *(undefined8 *)(this + lVar28 + 0x58 + 8);
        *(undefined8 *)((long)auStack_778 + lVar28 + 0x38) = *(undefined8 *)(this + lVar28 + 0x58);
        *(undefined8 *)((long)auStack_778 + lVar28 + 0x40) = uVar4;
        lVar28 = lVar28 + 0x70;
      } while (lVar28 != 0x6d8);
      local_bc = this[0x6dc];
      local_c0 = *(int *)(this + 0x6d8);
      local_b8 = *(QArrayData **)(this + 0x6e0);
      local_b0 = *(QWidget ***)(this + 0x6e8);
      local_a8 = *(qsizetype *)(this + 0x6f0);
      if (local_b8 != (QArrayData *)0x0) {
        LOCK();
        (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pcStack_520 = (code *)0x438222;
      bVar19 = QMainWindowLayoutState::insertGap
                         ((QMainWindowLayoutState *)local_3d8,(QList<int> *)&local_4d8,local_500);
      if (bVar19) {
        pcStack_520 = (code *)0x43823a;
        QVar38 = QMainWindowLayoutState::minimumSize((QMainWindowLayoutState *)local_3d8);
        if (((local_3d8._8_4_ - local_3d8._0_4_) + 1 < QVar38.wd.m_i.m_i) ||
           ((local_3d8._12_4_ - local_3d8._4_4_) + 1 < QVar38.ht.m_i.m_i)) goto LAB_004382ed;
        pcStack_520 = (code *)0x438277;
        QMainWindowLayoutState::fitLayout((QMainWindowLayoutState *)local_3d8);
        pcStack_520 = (code *)0x438282;
        QVar62 = QMainWindowLayoutState::gapRect
                           ((QMainWindowLayoutState *)local_3d8,(QList<int> *)(this + 0x7b0));
        *(QRect *)(this + 0x7c8) = QVar62;
        pcStack_520 = (code *)0x438298;
        pQVar27 = QLayout::parentWidget((QLayout *)this);
        pcStack_520 = (code *)0x4382b0;
        QDockAreaLayout::separatorRegion((QDockAreaLayout *)local_a0);
        pcStack_520 = (code *)0x4382bb;
        QWidget::update(pQVar27,(QRegion *)local_a0);
        pcStack_520 = (code *)0x4382c3;
        QRegion::~QRegion((QRegion *)local_a0);
        pQVar1 = local_4f8;
        pcStack_520 = (code *)0x4382d3;
        QMainWindowLayoutState::operator=(local_4f8,(QMainWindowLayoutState *)local_3d8);
        pcStack_520 = (code *)0x4382e3;
        applyState(this,pQVar1,true);
        pcStack_520 = (code *)0x4382eb;
        updateGapIndicator(this);
      }
      else {
LAB_004382ed:
        pcStack_520 = (code *)0x4382fa;
        restore(this,true);
      }
      if (local_b8 != (QArrayData *)0x0) {
        LOCK();
        (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pcStack_520 = (code *)0x438323;
          QArrayData::deallocate(local_b8,8,0x10);
        }
      }
      lVar28 = -0x1c0;
      pQVar41 = local_f0;
      do {
        pcStack_520 = (code *)0x43833a;
        QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(pQVar41);
        piVar2 = (int *)pQVar41[-3].size;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pcStack_520 = (code *)0x43835b;
            QArrayData::deallocate((QArrayData *)pQVar41[-3].size,8,0x10);
          }
        }
        pQVar41 = (QArrayDataPointer<QDockAreaLayoutItem> *)&pQVar41[-5].ptr;
        lVar28 = lVar28 + 0x70;
      } while (lVar28 != 0);
      lVar28 = 0xd8;
      do {
        pcStack_520 = (code *)0x43837a;
        QArrayDataPointer<QToolBarAreaLayoutLine>::~QArrayDataPointer
                  ((QArrayDataPointer<QToolBarAreaLayoutLine> *)(local_3d8 + lVar28));
        lVar28 = lVar28 + -0x38;
      } while (lVar28 != -8);
    }
  }
  if (&(local_4d8.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_4d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_4d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_4d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      pcStack_520 = (code *)0x4383cd;
      QArrayData::deallocate(&(local_4d8.d)->super_QArrayData,4,0x10);
    }
  }
LAB_00437302:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    pcStack_520 = tabwidgetPositionToTabBarShape;
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMainWindowLayout::hover(QLayoutItem *hoverTarget,
                              const QPoint &mousePos) {
  if (!parentWidget()->isVisible() || parentWidget()->isMinimized() ||
      pluggingWidget != nullptr || hoverTarget == nullptr)
    return;

  QWidget *widget = hoverTarget->widget();

#if QT_CONFIG(dockwidget)
    widget->raise();
    if ((dockOptions & QMainWindow::GroupedDragging) && (qobject_cast<QDockWidget*>(widget)
            || qobject_cast<QDockWidgetGroupWindow *>(widget))) {

        // Check if we are over another floating dock widget
        QVarLengthArray<QWidget *, 10> candidates;
        const auto siblings = parentWidget()->children();
        for (QObject *c : siblings) {
            QWidget *w = qobject_cast<QWidget*>(c);
            if (!w)
                continue;

            // Handle only dock widgets and group windows
            if (!qobject_cast<QDockWidget*>(w) && !qobject_cast<QDockWidgetGroupWindow *>(w))
                continue;

            // Check permission to dock on another dock widget or floating dock
            // FIXME in Qt 7

            if (w != widget && w->isWindow() && w->isVisible() && !w->isMinimized())
                candidates << w;

            if (QDockWidgetGroupWindow *group = qobject_cast<QDockWidgetGroupWindow *>(w)) {
                // floating QDockWidgets have a QDockWidgetGroupWindow as a parent,
                // if they have been hovered over
                const auto groupChildren = group->children();
                for (QObject *c : groupChildren) {
                    if (QDockWidget *dw = qobject_cast<QDockWidget*>(c)) {
                        if (dw != widget && dw->isFloating() && dw->isVisible() && !dw->isMinimized())
                            candidates << dw;
                    }
                }
            }
        }

        for (QWidget *w : candidates) {
            const QScreen *screen1 = qt_widget_private(widget)->associatedScreen();
            const QScreen *screen2 = qt_widget_private(w)->associatedScreen();
            if (screen1 && screen2 && screen1 != screen2)
                continue;
            if (!w->geometry().contains(mousePos))
                continue;

#if QT_CONFIG(tabwidget)
            if (auto dropTo = qobject_cast<QDockWidget *>(w)) {

                // w is the drop target's widget
                w = dropTo->widget();

                // Create a floating tab, unless already existing
                if (!qobject_cast<QDockWidgetGroupWindow *>(w)) {
                    QDockWidgetGroupWindow *floatingTabs = createTabbedDockWindow();
                    floatingTabs->setGeometry(dropTo->geometry());
                    QDockAreaLayoutInfo *info = floatingTabs->layoutInfo();
                    const QTabBar::Shape shape = tabwidgetPositionToTabBarShape(dropTo);

                    // dropTo and widget may be in a state where they transition
                    // from being a group window child to a single floating dock widget.
                    // In that case, their path to a main window dock may not have been
                    // updated yet.
                    // => ask both and fall back to dock 1 (right dock)
                    QInternal::DockPosition dockPosition = toDockPos(dockWidgetArea(dropTo));
                    if (dockPosition == QInternal::DockPosition::DockCount)
                        dockPosition = toDockPos(dockWidgetArea(widget));
                    if (dockPosition == QInternal::DockPosition::DockCount)
                        dockPosition = QInternal::DockPosition::RightDock;

                    *info = QDockAreaLayoutInfo(&layoutState.dockAreaLayout.sep, dockPosition,
                                                Qt::Horizontal, shape,
                                                static_cast<QMainWindow *>(parentWidget()));
                    info->tabBar = getTabBar();
                    info->tabbed = true;
                    info->add(dropTo);
                    QDockAreaLayoutInfo &parentInfo = layoutState.dockAreaLayout.docks[dockPosition];
                    parentInfo.add(floatingTabs);
                    dropTo->setParent(floatingTabs);
                    qCDebug(lcQpaDockWidgets) << "Wrapping" << widget << "into floating tabs" << floatingTabs;
                    w = floatingTabs;
                }

                // Show the drop target and raise widget to foreground
                dropTo->show();
                qCDebug(lcQpaDockWidgets) << "Showing" << dropTo;
                widget->raise();
                qCDebug(lcQpaDockWidgets) << "Raising" << widget;
            }
#endif
            auto *groupWindow = qobject_cast<QDockWidgetGroupWindow *>(w);
            Q_ASSERT(groupWindow);
            if (groupWindow->hover(hoverTarget, groupWindow->mapFromGlobal(mousePos))) {
                setCurrentHoveredFloat(groupWindow);
                applyState(layoutState); // update the tabbars
            }
            return;
        }
    }

    // If a temporary group window has been created during a hover,
    // remove it, if it has only one dockwidget child
    if (currentHoveredFloat)
        currentHoveredFloat->destroyIfSingleItemLeft();

    setCurrentHoveredFloat(nullptr);
    layoutState.dockAreaLayout.fallbackToSizeHints = false;
#endif // QT_CONFIG(dockwidget)

    QPoint pos = parentWidget()->mapFromGlobal(mousePos);

    if (!savedState.isValid())
        savedState = layoutState;

    QList<int> path = savedState.gapIndex(widget, pos);

    if (!path.isEmpty()) {
        bool allowed = false;

#if QT_CONFIG(dockwidget)
        allowed = isAreaAllowed(widget, path);
#endif
#if QT_CONFIG(toolbar)
        if (QToolBar *tb = qobject_cast<QToolBar*>(widget))
            allowed = tb->isAreaAllowed(toToolBarArea(path.at(1)));
#endif

        if (!allowed)
            path.clear();
    }

    if (path == currentGapPos)
        return; // the gap is already there

    currentGapPos = path;
    if (path.isEmpty()) {
        fixToolBarOrientation(hoverTarget, 2); // 2 = top dock, ie. horizontal
        restore(true);
        return;
    }

    fixToolBarOrientation(hoverTarget, currentGapPos.at(1));

    QMainWindowLayoutState newState = savedState;

    if (!newState.insertGap(path, hoverTarget)) {
        restore(true); // not enough space
        return;
    }

    QSize min = newState.minimumSize();
    QSize size = newState.rect.size();

    if (min.width() > size.width() || min.height() > size.height()) {
        restore(true);
        return;
    }

    newState.fitLayout();

    currentGapRect = newState.gapRect(currentGapPos);

#if QT_CONFIG(dockwidget)
    parentWidget()->update(layoutState.dockAreaLayout.separatorRegion());
#endif
    layoutState = std::move(newState);
    applyState(layoutState);

    updateGapIndicator();
}